

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_p.h
# Opt level: O0

uint32_t adler32_len_16(uint32_t adler,uint8_t *buf,size_t len,uint32_t sum2)

{
  uint32_t sum2_local;
  size_t len_local;
  uint8_t *buf_local;
  uint32_t adler_local;
  
  sum2_local = sum2;
  buf_local = buf;
  adler_local = adler;
  for (len_local = len; len_local != 0; len_local = len_local - 1) {
    adler_local = *buf_local + adler_local;
    sum2_local = adler_local + sum2_local;
    buf_local = buf_local + 1;
  }
  return adler_local % 0xfff1 | sum2_local % 0xfff1 << 0x10;
}

Assistant:

static inline uint32_t adler32_len_16(uint32_t adler, const uint8_t *buf, size_t len, uint32_t sum2) {
    while (len) {
        --len;
        adler += *buf++;
        sum2 += adler;
    }
    adler %= BASE;
    sum2 %= BASE;            /* only added so many BASE's */
    /* return recombined sums */
    return adler | (sum2 << 16);
}